

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void parser_eat_newline(VrplibParser *p)

{
  char *pcVar1;
  char *pcVar2;
  
  parser_eat_whitespaces(p);
  pcVar2 = p->at;
  while( true ) {
    while( true ) {
      if ((long)p->base - (long)pcVar2 == -p->size) {
        return;
      }
      if (*pcVar2 != '\n') break;
      p->curline = p->curline + 1;
      pcVar2 = pcVar2 + 1;
      p->at = pcVar2;
    }
    if (*pcVar2 != '\r') break;
    pcVar1 = pcVar2 + 1;
    p->at = pcVar1;
    if (((long)p->base - (long)pcVar1 != -p->size) && (*pcVar1 == '\n')) {
      p->at = pcVar2 + 2;
      pcVar1 = pcVar2 + 2;
    }
    pcVar2 = pcVar1;
    p->curline = p->curline + 1;
  }
  return;
}

Assistant:

static void parser_eat_newline(VrplibParser *p) {
    parser_eat_whitespaces(p);

    while (!parser_is_eof(p) && (*p->at == '\r' || *p->at == '\n')) {
        if (*p->at == '\r') {
            parser_adv(p, 1);
            if (!parser_is_eof(p) && (*p->at == '\n')) {
                parser_adv(p, 1);
            }
            p->curline += 1;
        } else {
            assert(*p->at == '\n');
            p->curline += 1;
            parser_adv(p, 1);
        }
    }
}